

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readconfig.c
# Opt level: O0

econf_err readConfigWithCallback
                    (econf_file **result,char *config_name,char *config_suffix,char *delim,
                    char *comment,char **conf_dirs,int conf_count,
                    _func__Bool_char_ptr_void_ptr *callback,void *callback_data)

{
  econf_err local_7c;
  econf_file **ppeStack_78;
  econf_err error;
  econf_file **key_files;
  size_t size;
  char **conf_dirs_local;
  char *comment_local;
  char *delim_local;
  char *config_suffix_local;
  char *config_name_local;
  econf_file **result_local;
  
  key_files = (econf_file **)0x0;
  ppeStack_78 = (econf_file **)0x0;
  if (*result == (econf_file *)0x0) {
    result_local._4_4_ = ECONF_ARGUMENT_IS_NULL_VALUE;
  }
  else {
    size = (size_t)conf_dirs;
    conf_dirs_local = (char **)comment;
    comment_local = delim;
    delim_local = config_suffix;
    config_suffix_local = config_name;
    config_name_local = (char *)result;
    if ((*result)->conf_count < 1) {
      local_7c = readConfigHistoryWithCallback
                           (&stack0xffffffffffffff88,(size_t *)&key_files,(*result)->parse_dirs,
                            (*result)->parse_dirs_count,config_name,config_suffix,delim,comment,
                            (_Bool)((*result)->join_same_entries & 1),
                            (_Bool)((*result)->python_style & 1),conf_dirs,conf_count,callback,
                            callback_data);
    }
    else {
      local_7c = readConfigHistoryWithCallback
                           (&stack0xffffffffffffff88,(size_t *)&key_files,(*result)->parse_dirs,
                            (*result)->parse_dirs_count,config_name,config_suffix,delim,comment,
                            (_Bool)((*result)->join_same_entries & 1),
                            (_Bool)((*result)->python_style & 1),(*result)->conf_dirs,
                            (*result)->conf_count,callback,callback_data);
    }
    if (local_7c == ECONF_SUCCESS) {
      if (ppeStack_78 != (econf_file **)0x0) {
        econf_freeFile(*(econf_file **)config_name_local);
        config_name_local[0] = '\0';
        config_name_local[1] = '\0';
        config_name_local[2] = '\0';
        config_name_local[3] = '\0';
        config_name_local[4] = '\0';
        config_name_local[5] = '\0';
        config_name_local[6] = '\0';
        config_name_local[7] = '\0';
        local_7c = merge_econf_files(ppeStack_78,(econf_file **)config_name_local);
        free(ppeStack_78);
      }
      result_local._4_4_ = local_7c;
    }
    else {
      result_local._4_4_ = local_7c;
    }
  }
  return result_local._4_4_;
}

Assistant:

econf_err readConfigWithCallback(econf_file **result,
				 const char *config_name,
				 const char *config_suffix,
				 const char *delim,
				 const char *comment,
				 char **conf_dirs,
				 const int conf_count,
				 bool (*callback)(const char *filename, const void *data),
				 const void *callback_data)
{
  size_t size = 0;
  econf_file **key_files = NULL;
  econf_err error = ECONF_SUCCESS;

  if (*result == NULL)
    return ECONF_ARGUMENT_IS_NULL_VALUE;

  if ((*result)->conf_count > 0) {
    /* Setting defined in econf_file have higher priority */
    error = readConfigHistoryWithCallback(&key_files,
					  &size,
					  (*result)->parse_dirs,
					  (*result)->parse_dirs_count,
					  config_name,
					  config_suffix,
					  delim,
					  comment,
					  (*result)->join_same_entries,
					  (*result)->python_style,
					  (*result)->conf_dirs,
					  (*result)->conf_count,
					  callback,
					  callback_data);
  } else {
    error = readConfigHistoryWithCallback(&key_files,
					  &size,
					  (*result)->parse_dirs,
					  (*result)->parse_dirs_count,
					  config_name,
					  config_suffix,
					  delim,
					  comment,
					  (*result)->join_same_entries,
					  (*result)->python_style,
					  conf_dirs,
					  conf_count,
					  callback,
					  callback_data);
  }

  if (error != ECONF_SUCCESS)
    return error;

  if (key_files) {
    econf_free(*result);
    *result = NULL;
    // Merge the list of acquired key_files into merged_file
    error = merge_econf_files(key_files, result);
    free(key_files);
  }

  return error;
}